

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-walk-handles.c
# Opt level: O2

int run_test_walk_handles(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = uv_default_loop();
  iVar1 = uv_timer_init(loop,&timer);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_timer_start(&timer,timer_cb,1,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = (int64_t)seen_timer_handle;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = 1;
          eval_b = (int64_t)seen_timer_handle;
          if (eval_b == 1) {
            seen_timer_handle = 0;
            uv_walk(loop,walk_cb,magic_cookie);
            eval_a = (int64_t)seen_timer_handle;
            eval_b = 0;
            if (eval_a == 0) {
              uv_walk(loop,close_walk_cb,(void *)0x0);
              uv_run(loop,UV_RUN_DEFAULT);
              eval_a = 0;
              iVar1 = uv_loop_close(loop);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar3 = "uv_loop_close(loop)";
              pcVar2 = "0";
              uVar4 = 0x4b;
            }
            else {
              pcVar3 = "0";
              pcVar2 = "seen_timer_handle";
              uVar4 = 0x49;
            }
          }
          else {
            pcVar3 = "seen_timer_handle";
            pcVar2 = "1";
            uVar4 = 0x44;
          }
        }
        else {
          pcVar3 = "0";
          pcVar2 = "r";
          uVar4 = 0x43;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "seen_timer_handle";
        uVar4 = 0x41;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "r";
      uVar4 = 0x3e;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "r";
    uVar4 = 0x3b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-walk-handles.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(walk_handles) {
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, timer_cb, 1, 0);
  ASSERT_OK(r);

  /* Start event loop, expect to see the timer handle in walk_cb. */
  ASSERT_OK(seen_timer_handle);
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, seen_timer_handle);

  /* Loop is finished, walk_cb should not see our timer handle. */
  seen_timer_handle = 0;
  uv_walk(loop, walk_cb, magic_cookie);
  ASSERT_OK(seen_timer_handle);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}